

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocatorFactory.cpp
# Opt level: O0

FUNCTION_RETURN
license::locate::LocatorFactory::get_active_strategies
          (vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
           *strategies,LicenseLocation *locationHint)

{
  LicenseLocation *pLVar1;
  pointer pLVar2;
  EnvironmentVarData *this;
  ExternalDefinition *this_00;
  size_type sVar3;
  unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
  local_48;
  unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
  local_40;
  unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
  local_38 [3];
  unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
  local_20;
  LicenseLocation *local_18;
  LicenseLocation *locationHint_local;
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  *strategies_local;
  
  local_18 = locationHint;
  locationHint_local = (LicenseLocation *)strategies;
  if ((find_license_near_moduleb & 1) != 0) {
    pLVar2 = (pointer)operator_new(0x28);
    ApplicationFolder::ApplicationFolder((ApplicationFolder *)pLVar2);
    std::
    unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
    ::unique_ptr<std::default_delete<license::locate::LocatorStrategy>,void>
              ((unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
                *)&local_20,pLVar2);
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
    ::push_back(strategies,(value_type *)&local_20);
    std::
    unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
    ::~unique_ptr(&local_20);
  }
  pLVar1 = locationHint_local;
  if ((find_license_with_env_varb & 1) != 0) {
    pLVar2 = (pointer)operator_new(0x28);
    EnvironmentVarLocation::EnvironmentVarLocation((EnvironmentVarLocation *)pLVar2);
    std::
    unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
    ::unique_ptr<std::default_delete<license::locate::LocatorStrategy>,void>
              ((unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
                *)local_38,pLVar2);
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
    ::push_back((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                 *)pLVar1,(value_type *)local_38);
    std::
    unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
    ::~unique_ptr(local_38);
    pLVar1 = locationHint_local;
    this = (EnvironmentVarData *)operator_new(0x30);
    EnvironmentVarData::EnvironmentVarData(this);
    std::
    unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
    ::unique_ptr<std::default_delete<license::locate::LocatorStrategy>,void>
              ((unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
                *)&local_40,(pointer)this);
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
    ::push_back((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                 *)pLVar1,(value_type *)&local_40);
    std::
    unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
    ::~unique_ptr(&local_40);
  }
  pLVar1 = locationHint_local;
  if (local_18 != (LicenseLocation *)0x0) {
    this_00 = (ExternalDefinition *)operator_new(0x30);
    ExternalDefinition::ExternalDefinition(this_00,local_18);
    std::
    unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
    ::unique_ptr<std::default_delete<license::locate::LocatorStrategy>,void>
              ((unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>
                *)&local_48,(pointer)this_00);
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
    ::push_back((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                 *)pLVar1,(value_type *)&local_48);
    std::
    unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
    ::~unique_ptr(&local_48);
  }
  sVar3 = std::
          vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
          ::size((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                  *)locationHint_local);
  return (uint)(sVar3 == 0);
}

Assistant:

FUNCTION_RETURN LocatorFactory::get_active_strategies(std::vector<std::unique_ptr<LocatorStrategy>> &strategies,
													  const LicenseLocation *locationHint) {
	if (find_license_near_moduleb) {
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new ApplicationFolder())));
	}
	if (find_license_with_env_varb) {
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new EnvironmentVarLocation())));
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new EnvironmentVarData())));
	}
	if (locationHint != nullptr) {
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new ExternalDefinition(locationHint))));
	}
	return strategies.size() > 0 ? FUNC_RET_OK : FUNC_RET_NOT_AVAIL;
}